

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.c
# Opt level: O1

int drain_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  int converter_type;
  long *plVar1;
  SRC_STATE *state;
  code *pcVar2;
  ulong uVar3;
  int iStack_1c;
  
  if (field == 1) {
    if (*value == '\x01') {
      pcVar2 = mix_noop;
    }
    else {
      pcVar2 = drain_segment_mix;
    }
    segment->mix = pcVar2;
    return 1;
  }
  plVar1 = (long *)segment->data;
  if (field == 1) {
    if (*value == '\x01') {
      if (*(char *)(*plVar1 + 0x1c) != '\0') {
        uVar3 = 0;
        do {
          mixed_buffer_clear((mixed_buffer *)plVar1[uVar3 + 1]);
          uVar3 = uVar3 + 1;
        } while (uVar3 < *(byte *)(*plVar1 + 0x1c));
      }
      pcVar2 = mix_noop;
    }
    else {
      pcVar2 = source_segment_mix;
    }
    segment->mix = pcVar2;
  }
  else {
    if (field != 3) {
      if (field == 4) {
        converter_type = *value;
        *(int *)((long)plVar1 + 0x7c) = converter_type;
        state = src_new(converter_type,(uint)*(byte *)(*plVar1 + 0x1c),&iStack_1c);
        if (state == (SRC_STATE *)0x0) {
          source_segment_set_cold_1();
        }
        else {
          src_delete(state);
        }
        return (uint)(state != (SRC_STATE *)0x0);
      }
      mixed_err(7);
      return 0;
    }
    *(undefined4 *)(plVar1 + 0xf) = *value;
  }
  return 1;
}

Assistant:

int drain_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  switch(field){
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = mix_noop;
    }else{
      segment->mix = drain_segment_mix;
    }
    return 1;
  default:
    return source_segment_set(field, value, segment);
  }
}